

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fl_plastic.cxx
# Opt level: O2

void shade_round(int x,int y,int w,int h,char *c,Fl_Color bc)

{
  ulong uVar1;
  ulong uVar2;
  uint uVar3;
  Fl_Color FVar4;
  uint uVar5;
  uchar *puVar6;
  size_t sVar7;
  _func_int *UNRECOVERED_JUMPTABLE;
  int iVar8;
  int iVar9;
  int iVar10;
  uint uVar11;
  ulong uVar12;
  uint uVar13;
  ulong uVar14;
  int iVar15;
  int iVar16;
  ulong uVar17;
  undefined8 uVar18;
  undefined8 uVar19;
  uint local_cc;
  ulong local_90;
  long local_80;
  
  local_90 = (ulong)(uint)h;
  uVar17 = (ulong)(uint)w;
  puVar6 = fl_gray_ramp();
  sVar7 = strlen(c);
  iVar8 = (int)sVar7 + -1;
  uVar3 = iVar8 / 2;
  uVar12 = 0;
  if (0 < (int)uVar3) {
    uVar12 = (ulong)uVar3;
  }
  local_80 = (long)iVar8;
  if (h < w) {
    iVar8 = h / 2;
    uVar11 = (w + x) - iVar8;
    iVar9 = (w + x) - h;
    local_cc = y + h;
    uVar5 = 0x195;
    for (uVar14 = 0; local_cc = local_cc - 1, iVar15 = (int)local_90, iVar10 = (int)uVar14,
        uVar12 != uVar14; uVar14 = uVar14 + 1) {
      uVar1 = (uint)y + uVar14;
      uVar2 = (uint)x + uVar14;
      FVar4 = shade_color(puVar6[c[uVar14]],bc);
      (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x11])
                (fl_graphics_driver,(ulong)FVar4);
      (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x21])
                (0x4056800000000000,fl_graphics_driver,uVar2 & 0xffffffff,uVar1 & 0xffffffff,
                 local_90,local_90);
      (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[6])
                (fl_graphics_driver,(ulong)(uint)(iVar8 + x),uVar1 & 0xffffffff,(ulong)uVar11);
      uVar13 = iVar9 + iVar10;
      (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x21])
                ((double)(uVar5 - 0x168),0x4056800000000000,fl_graphics_driver,(ulong)uVar13,
                 uVar1 & 0xffffffff,local_90,local_90);
      FVar4 = shade_color(puVar6[(long)c[uVar14] + -2],bc);
      (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x11])
                (fl_graphics_driver,(ulong)FVar4);
      (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x21])
                ((double)(uVar5 - 0x5a),(double)uVar5,fl_graphics_driver,(ulong)uVar13,
                 uVar1 & 0xffffffff,local_90,local_90);
      FVar4 = shade_color(puVar6[c[local_80]],bc);
      (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x11])
                (fl_graphics_driver,(ulong)FVar4);
      (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x21])
                (0x4070e00000000000,(double)(uVar5 - 0x5a),fl_graphics_driver,uVar13,
                 uVar1 & 0xffffffff,local_90,local_90);
      (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[6])
                (fl_graphics_driver,(ulong)(uint)(iVar8 + x),(ulong)local_cc,(ulong)uVar11);
      (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x21])
                ((double)(uVar5 - 0xb4),0x4070e00000000000,fl_graphics_driver,uVar2 & 0xffffffff,
                 uVar1 & 0xffffffff,local_90,local_90);
      FVar4 = shade_color(puVar6[(long)c[local_80] + -2],bc);
      (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x11])
                (fl_graphics_driver,(ulong)FVar4);
      (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x21])
                ((double)(uVar5 - 0x10e),(double)(uVar5 - 0xb4),fl_graphics_driver,
                 uVar2 & 0xffffffff,uVar1,local_90,local_90);
      uVar17 = (ulong)((int)uVar17 - 2);
      local_90 = (ulong)(iVar15 - 2);
      uVar5 = uVar5 + 8;
      local_80 = local_80 + -1;
    }
    FVar4 = shade_color(puVar6[c[(int)uVar3]],bc);
    (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x11])(fl_graphics_driver,(ulong)FVar4);
    uVar3 = y + iVar10;
    (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[4])
              (fl_graphics_driver,(ulong)(uint)((iVar8 - iVar10) + x + iVar10),(ulong)uVar3,
               (ulong)(((int)uVar17 - iVar15) + 1),(ulong)(iVar15 + 1));
    (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x21])
              (0x4056800000000000,0x4070e00000000000,fl_graphics_driver,(ulong)(uint)(x + iVar10),
               (ulong)uVar3,local_90,local_90);
    uVar5 = iVar9 + iVar10;
    UNRECOVERED_JUMPTABLE = (fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x21];
    uVar18 = 0x4070e00000000000;
    uVar19 = 0x4056800000000000;
  }
  else {
    iVar8 = w / 2;
    uVar5 = (y + h) - iVar8;
    iVar9 = h + 1;
    iVar10 = (y + h) - w;
    local_cc = w + x;
    uVar11 = 0x13b;
    local_90 = uVar17;
    for (uVar14 = 0; local_cc = local_cc - 1, iVar15 = (int)uVar14, iVar16 = (int)local_90,
        uVar12 != uVar14; uVar14 = uVar14 + 1) {
      uVar17 = (uint)y + uVar14;
      uVar1 = (uint)x + uVar14;
      FVar4 = shade_color(puVar6[c[uVar14]],bc);
      (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x11])
                (fl_graphics_driver,(ulong)FVar4);
      (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x21])
                (fl_graphics_driver,uVar1 & 0xffffffff,uVar17 & 0xffffffff,local_90,local_90);
      FVar4 = shade_color(puVar6[(long)c[uVar14] + -2],bc);
      (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x11])
                (fl_graphics_driver,(ulong)FVar4);
      (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x21])
                (0,(double)(uVar11 - 0x10e),fl_graphics_driver,uVar1 & 0xffffffff,
                 uVar17 & 0xffffffff,local_90,local_90);
      (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[9])
                (fl_graphics_driver,(ulong)local_cc,(ulong)(uint)(iVar8 + y),(ulong)uVar5);
      uVar13 = iVar10 + iVar15;
      (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x21])
                ((double)uVar11,0x4076800000000000,fl_graphics_driver,uVar1 & 0xffffffff,
                 (ulong)uVar13,local_90,local_90);
      FVar4 = shade_color(puVar6[c[local_80]],bc);
      (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x11])
                (fl_graphics_driver,(ulong)FVar4);
      (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x21])
                ((double)(uVar11 - 0x5a),(double)uVar11,fl_graphics_driver,uVar1 & 0xffffffff,
                 (ulong)uVar13,local_90,local_90);
      FVar4 = shade_color(puVar6[(long)c[local_80] + -2],bc);
      (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x11])
                (fl_graphics_driver,(ulong)FVar4);
      (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x21])
                (0x4066800000000000,(double)(uVar11 - 0x5a),fl_graphics_driver,uVar1 & 0xffffffff,
                 (ulong)uVar13,local_90,local_90);
      (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[9])
                (fl_graphics_driver,uVar1 & 0xffffffff,(ulong)(uint)(iVar8 + y),(ulong)uVar5);
      (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x21])
                ((double)(uVar11 - 0xb4),0x4066800000000000,fl_graphics_driver,uVar1 & 0xffffffff,
                 uVar17,local_90,local_90);
      local_90 = (ulong)(iVar16 - 2);
      uVar11 = uVar11 + 8;
      local_80 = local_80 + -1;
      iVar9 = iVar9 + -2;
    }
    FVar4 = shade_color(puVar6[c[(int)uVar3]],bc);
    (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x11])(fl_graphics_driver,(ulong)FVar4);
    uVar5 = x + iVar15;
    (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[4])
              (fl_graphics_driver,(ulong)uVar5,(ulong)(uint)((iVar8 - iVar15) + y + iVar15),
               (ulong)(iVar16 + 1),(ulong)(uint)(iVar9 - iVar16));
    (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x21])
              (0,0x4066800000000000,fl_graphics_driver,(ulong)uVar5,(ulong)(uint)(y + iVar15),
               local_90,local_90);
    uVar3 = iVar10 + iVar15;
    UNRECOVERED_JUMPTABLE = (fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x21];
    uVar19 = 0x4076800000000000;
    uVar18 = 0x4066800000000000;
  }
  (*UNRECOVERED_JUMPTABLE)
            (uVar18,uVar19,fl_graphics_driver,(ulong)uVar5,(ulong)uVar3,local_90,local_90);
  return;
}

Assistant:

static void shade_round(int x, int y, int w, int h, const char *c, Fl_Color bc) {
  const uchar *g = fl_gray_ramp();
  int	i;
  int 	clen = (int) (strlen(c) - 1);
  int 	chalf = clen / 2;

  if (w>h) {
    int d = h/2;
    const int na = 8;
    for (i=0; i<chalf; i++, d--, x++, y++, w-=2, h-=2)
    {
      fl_color(shade_color(g[(int)c[i]], bc));
      fl_pie(x, y, h, h, 90.0, 135.0+i*na);
      fl_xyline(x+d, y, x+w-d);
      fl_pie(x+w-h, y, h, h, 45.0+i*na, 90.0);
      fl_color(shade_color(g[(int)c[i] - 2], bc));
      fl_pie(x+w-h, y, h, h, 315.0+i*na, 405.0+i*na);
      fl_color(shade_color(g[(int)c[clen - i]], bc));
      fl_pie(x+w-h, y, h, h, 270.0, 315.0+i*na);
      fl_xyline(x+d, y+h-1, x+w-d);
      fl_pie(x, y, h, h, 225.0+i*na, 270.0);
      fl_color(shade_color(g[c[(int)clen - i] - 2], bc));
      fl_pie(x, y, h, h, 135.0+i*na, 225.0+i*na);
    }
    fl_color(shade_color(g[(int)c[chalf]], bc));
    fl_rectf(x+d, y, w-h+1, h+1);
    fl_pie(x, y, h, h, 90.0, 270.0);
    fl_pie(x+w-h, y, h, h, 270.0, 90.0);
  } else {
    int d = w/2;
    const int na = 8;
    for (i=0; i<chalf; i++, d--, x++, y++, w-=2, h-=2)
    {
      fl_color(shade_color(g[(int)c[i]], bc));
      fl_pie(x, y, w, w, 45.0+i*na, 135.0+i*na);
      fl_color(shade_color(g[c[i] - 2], bc));
      fl_pie(x, y, w, w, 0.0, 45.0+i*na);
      fl_yxline(x+w-1, y+d, y+h-d);
      fl_pie(x, y+h-w, w, w, 315.0+i*na, 360.0);
      fl_color(shade_color(g[(int)c[clen - i]], bc));
      fl_pie(x, y+h-w, w, w, 225.0+i*na, 315.0+i*na);
      fl_color(shade_color(g[c[clen - i] - 2], bc));
      fl_pie(x, y+h-w, w, w, 180.0, 225.0+i*na);
      fl_yxline(x, y+d, y+h-d);
      fl_pie(x, y, w, w, 135.0+i*na, 180.0);
    }
    fl_color(shade_color(g[(int)c[chalf]], bc));
    fl_rectf(x, y+d, w+1, h-w+1);
    fl_pie(x, y, w, w, 0.0, 180.0);
    fl_pie(x, y+h-w, w, w, 180.0, 360.0);
  }
}